

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectValue this;
  SQObjectPtr local_30;
  
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(size + 0x58);
  SQUserData::SQUserData(this.pUserData,ss);
  (this.pTable)->_firstfree = (_HashNode *)(size + 8);
  (this.pTable)->_numofnodes = 0;
  local_30.super_SQObject._type = OT_USERDATA;
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal.pUserPointer = this.pUserPointer;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return (SQUserPointer)((ulong)((long)&(this.pTable)->_usednodes + 7U) & 0xfffffffffffffff8);
}

Assistant:

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)
{
    SQUserData *ud = SQUserData::Create(_ss(v), size + SQ_ALIGNMENT);
    v->Push(ud);
    return (SQUserPointer)sq_aligning(ud + 1);
}